

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::handleIoResizeArrayAccess
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  ulong uVar4;
  TQualifier *qualifier;
  TType *this_00;
  int newSize;
  TIntermSymbol *symbolNode;
  TIntermTyped *base_local;
  TSourceLoc *param_1_local;
  TParseContext *this_local;
  long *plVar2;
  
  iVar1 = (*(base->super_TIntermNode)._vptr_TIntermNode[0xc])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    __assert_fail("symbolNode",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x305,
                  "void glslang::TParseContext::handleIoResizeArrayAccess(const TSourceLoc &, TIntermTyped *)"
                 );
  }
  if (plVar2 != (long *)0x0) {
    plVar3 = (long *)(**(code **)(*plVar2 + 0xf0))();
    uVar4 = (**(code **)(*plVar3 + 0xf8))();
    if ((uVar4 & 1) != 0) {
      plVar3 = (long *)(**(code **)(*plVar2 + 0xf0))();
      qualifier = (TQualifier *)(**(code **)(*plVar3 + 0x58))();
      iVar1 = getIoArrayImplicitSize(this,qualifier,(TString *)0x0);
      if (0 < iVar1) {
        this_00 = (TType *)(**(code **)(*plVar2 + 0xf8))();
        TType::changeOuterArraySize(this_00,iVar1);
      }
    }
  }
  return;
}

Assistant:

void TParseContext::handleIoResizeArrayAccess(const TSourceLoc& /*loc*/, TIntermTyped* base)
{
    TIntermSymbol* symbolNode = base->getAsSymbolNode();
    assert(symbolNode);
    if (! symbolNode)
        return;

    // fix array size, if it can be fixed and needs to be fixed (will allow variable indexing)
    if (symbolNode->getType().isUnsizedArray()) {
        int newSize = getIoArrayImplicitSize(symbolNode->getType().getQualifier());
        if (newSize > 0)
            symbolNode->getWritableType().changeOuterArraySize(newSize);
    }
}